

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O0

int __thiscall
bdDebugCallback::dhtValueCallback(bdDebugCallback *this,bdNodeId *id,string *key,uint32_t status)

{
  uint32_t status_local;
  string *key_local;
  bdNodeId *id_local;
  bdDebugCallback *this_local;
  
  bdStdPrintNodeId((ostream *)&std::cerr,id);
  return 1;
}

Assistant:

int bdDebugCallback::dhtValueCallback(const bdNodeId *id, std::string key, uint32_t status) {
	/* remove unused parameter warnings */
	(void) key;
	(void) status;

#ifdef DEBUG_MGR
	std::cerr << "bdDebugCallback::dhtValueCallback() Id: ";
#endif
	bdStdPrintNodeId(std::cerr, id);
#ifdef DEBUG_MGR
	std::cerr << " key: " << key;
	std::cerr << " status: " << std::hex << status << std::dec << std::endl;
#endif

	return 1;
}